

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::MatteMaterial::readFrom(MatteMaterial *this,BinaryReader *binary)

{
  size_t sVar1;
  pointer puVar2;
  undefined8 uVar3;
  size_t sVar4;
  runtime_error *this_00;
  
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_kd);
  sVar1 = binary->currentEntityOffset;
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0xc) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    (this->kd).z = *(float *)(puVar2 + sVar1 + 8);
    uVar3 = *(undefined8 *)(puVar2 + sVar1);
    (this->kd).x = (float)(int)uVar3;
    (this->kd).y = (float)(int)((ulong)uVar3 >> 0x20);
    sVar4 = binary->currentEntityOffset;
    sVar1 = sVar4 + 0xc;
    binary->currentEntityOffset = sVar1;
    puVar2 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (sVar4 + 0x10 <=
        (ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2)) {
      this->sigma = *(float *)(puVar2 + sVar1);
      binary->currentEntityOffset = binary->currentEntityOffset + 4;
      BinaryReader::read<pbrt::Texture>(binary,&this->map_sigma);
      BinaryReader::read<pbrt::Texture>(binary,&this->map_bump);
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MatteMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(map_kd);
    binary.read(kd);
    binary.read(sigma);
    binary.read(map_sigma);
    binary.read(map_bump);
  }